

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O1

edata_t * duckdb_je_eset_fit(eset_t *eset,size_t esize,size_t alignment,_Bool exact_only,
                            uint lg_max_fit)

{
  long lVar1;
  _Bool _Var2;
  ulong uVar3;
  size_t sVar4;
  edata_t *peVar5;
  edata_t *peVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint64_t uVar15;
  fb_group_t fVar16;
  ulong uVar17;
  bool bVar18;
  uint local_50;
  
  uVar3 = alignment + 0xfff & 0xfffffffffffff000;
  uVar17 = (esize - 0x1000) + uVar3;
  if (uVar17 < esize) {
    return (edata_t *)0x0;
  }
  sVar4 = duckdb_je_sz_psz_quantize_ceil(uVar17);
  if (sVar4 < 0x7000000000000001) {
    uVar10 = sVar4 - 1;
    if (uVar10 == 0) {
      uVar8 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar8 = (uint)lVar1 ^ 0x3f;
    }
    iVar14 = 0x32 - uVar8;
    if (0x32 < uVar8) {
      iVar14 = 0;
    }
    bVar7 = 0xc;
    if (0x4000 < sVar4) {
      bVar7 = (char)iVar14 + 0xb;
    }
    uVar10 = (ulong)(((uint)(uVar10 >> (bVar7 & 0x3f)) & 3) + iVar14 * 4);
  }
  else {
    uVar10 = 199;
  }
  if (exact_only) {
    _Var2 = duckdb_je_edata_heap_empty(&eset->bins[uVar10].heap);
    if (!_Var2) {
      peVar5 = duckdb_je_edata_heap_first(&eset->bins[uVar10].heap);
      goto LAB_01c806db;
    }
  }
  else {
    uVar12 = uVar10 >> 6;
    uVar10 = (eset->bitmap[uVar12] >> ((byte)uVar10 & 0x3f)) << ((byte)uVar10 & 0x3f);
    while (uVar10 == 0) {
      if (uVar12 == 3) {
        uVar13 = 200;
        goto LAB_01c80601;
      }
      lVar1 = uVar12 + 1;
      uVar12 = uVar12 + 1;
      uVar10 = eset->bitmap[lVar1];
    }
    uVar13 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    uVar13 = uVar12 << 6 | uVar13;
LAB_01c80601:
    uVar10 = uVar13 & 0xffffffff;
    if (uVar10 < 200) {
      uVar12 = 0;
      uVar15 = 0;
      peVar5 = (edata_t *)0x0;
      do {
        if (lg_max_fit == 0x40) {
          lg_max_fit = 0x3f;
        }
        if (uVar17 < duckdb_je_sz_pind2sz_tab[uVar13 & 0xffffffff] >> ((byte)lg_max_fit & 0x3f))
        break;
        if ((peVar5 == (edata_t *)0x0) ||
           (uVar13 = eset->bins[uVar10].heap_min.sn,
           (int)(((uint)(uVar15 < uVar13) - (uint)(uVar13 < uVar15)) * 2 -
                (uint)(eset->bins[uVar10].heap_min.addr < uVar12)) < 0)) {
          peVar5 = duckdb_je_edata_heap_first(&eset->bins[uVar10].heap);
          uVar15 = eset->bins[uVar10].heap_min.sn;
          uVar12 = eset->bins[uVar10].heap_min.addr;
        }
        if (uVar10 == 199) break;
        uVar11 = uVar10 + 1 >> 6;
        bVar7 = (byte)(uVar10 + 1);
        fVar16 = (eset->bitmap[uVar11] >> (bVar7 & 0x3f)) << (bVar7 & 0x3f);
        while (fVar16 == 0) {
          if (uVar11 == 3) {
            uVar13 = 200;
            goto LAB_01c806c0;
          }
          lVar1 = uVar11 + 1;
          uVar11 = uVar11 + 1;
          fVar16 = eset->bitmap[lVar1];
        }
        uVar13 = 0;
        if (fVar16 != 0) {
          for (; (fVar16 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        uVar13 = uVar11 << 6 | uVar13;
LAB_01c806c0:
        uVar10 = uVar13 & 0xffffffff;
      } while (uVar10 < 200);
      goto LAB_01c806db;
    }
  }
  peVar5 = (edata_t *)0x0;
LAB_01c806db:
  if (alignment < 0x1001) {
    return peVar5;
  }
  if (peVar5 != (edata_t *)0x0) {
    return peVar5;
  }
  sVar4 = duckdb_je_sz_psz_quantize_ceil(esize);
  if (sVar4 < 0x7000000000000001) {
    uVar10 = sVar4 - 1;
    if (uVar10 == 0) {
      uVar8 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar8 = (uint)lVar1 ^ 0x3f;
    }
    iVar14 = 0x32 - uVar8;
    if (0x32 < uVar8) {
      iVar14 = 0;
    }
    bVar7 = 0xc;
    if (0x4000 < sVar4) {
      bVar7 = (char)iVar14 + 0xb;
    }
    uVar8 = ((uint)(uVar10 >> (bVar7 & 0x3f)) & 3) + iVar14 * 4;
  }
  else {
    uVar8 = 199;
  }
  sVar4 = duckdb_je_sz_psz_quantize_ceil(uVar17);
  if (sVar4 < 0x7000000000000001) {
    uVar17 = sVar4 - 1;
    if (uVar17 == 0) {
      uVar9 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar9 = (uint)lVar1 ^ 0x3f;
    }
    iVar14 = 0x32 - uVar9;
    if (0x32 < uVar9) {
      iVar14 = 0;
    }
    bVar7 = 0xc;
    if (0x4000 < sVar4) {
      bVar7 = (char)iVar14 + 0xb;
    }
    local_50 = ((uint)(uVar17 >> (bVar7 & 0x3f)) & 3) + iVar14 * 4;
  }
  else {
    local_50 = 199;
  }
  uVar10 = (ulong)(uVar8 >> 6);
  uVar17 = (eset->bitmap[uVar10] >> ((byte)uVar8 & 0x3f)) << ((byte)uVar8 & 0x3f);
  do {
    if (uVar17 != 0) {
      uVar12 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      uVar12 = uVar10 << 6 | uVar12;
LAB_01c807dd:
      if ((uint)uVar12 < local_50) {
        peVar5 = (edata_t *)eset->bins;
        do {
          peVar6 = duckdb_je_edata_heap_first(&eset->bins[uVar12 & 0xffffffff].heap);
          uVar17 = (ulong)peVar6->e_addr & 0xfffffffffffff000;
          uVar13 = uVar17 + (uVar3 - 1) & -uVar3;
          uVar10 = ((peVar6->field_2).e_size_esn & 0xfffffffffffff000) + uVar17;
          bVar18 = esize <= uVar10 - uVar13;
          if (!bVar18) {
            peVar6 = peVar5;
          }
          if (uVar13 < uVar17 || uVar10 <= uVar13) {
            peVar6 = peVar5;
          }
          if ((uVar13 >= uVar17 && uVar10 > uVar13) && bVar18) {
            return peVar6;
          }
          uVar17 = (uVar12 & 0xffffffff) + 1;
          uVar10 = uVar17 >> 6;
          bVar7 = (byte)uVar17;
          uVar17 = (eset->bitmap[uVar10] >> (bVar7 & 0x3f)) << (bVar7 & 0x3f);
          while (uVar17 == 0) {
            if (uVar10 == 3) {
              uVar12 = 200;
              goto LAB_01c8089f;
            }
            lVar1 = uVar10 + 1;
            uVar10 = uVar10 + 1;
            uVar17 = eset->bitmap[lVar1];
          }
          uVar12 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar12 = uVar10 << 6 | uVar12;
LAB_01c8089f:
          peVar5 = peVar6;
        } while ((uint)uVar12 < local_50);
      }
      return (edata_t *)0x0;
    }
    if (uVar10 == 3) {
      uVar12 = 200;
      goto LAB_01c807dd;
    }
    uVar17 = eset->bitmap[uVar10 + 1];
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

edata_t *
eset_fit(eset_t *eset, size_t esize, size_t alignment, bool exact_only,
    unsigned lg_max_fit) {
	size_t max_size = esize + PAGE_CEILING(alignment) - PAGE;
	/* Beware size_t wrap-around. */
	if (max_size < esize) {
		return NULL;
	}

	edata_t *edata = eset_first_fit(eset, max_size, exact_only, lg_max_fit);

	if (alignment > PAGE && edata == NULL) {
		/*
		 * max_size guarantees the alignment requirement but is rather
		 * pessimistic.  Next we try to satisfy the aligned allocation
		 * with sizes in [esize, max_size).
		 */
		edata = eset_fit_alignment(eset, esize, max_size, alignment);
	}

	return edata;
}